

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLifetimeTests.cpp
# Opt level: O2

GLint deqp::gls::LifetimeTests::details::getInteger(ContextWrapper *gl,GLenum queryParam)

{
  ostringstream *this;
  GLenum err;
  GLint ret;
  undefined1 local_190 [384];
  
  ret = 0;
  glu::CallLogWrapper::glGetIntegerv(&gl->super_CallLogWrapper,queryParam,&ret);
  err = glu::CallLogWrapper::glGetError(&gl->super_CallLogWrapper);
  glu::checkError(err,"gl.glGetIntegerv(queryParam, &ret)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsLifetimeTests.cpp"
                  ,0x51);
  local_190._0_8_ = ((gl->m_ctx).m_testCtx)->m_log;
  this = (ostringstream *)(local_190 + 8);
  std::__cxx11::ostringstream::ostringstream(this);
  std::operator<<((ostream *)this,"// Single integer output: ");
  std::ostream::operator<<(this,ret);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this);
  return ret;
}

Assistant:

GLint getInteger (ContextWrapper& gl, GLenum queryParam)
{
	GLint ret = 0;
	GLU_CHECK_CALL_ERROR(
		gl.glGetIntegerv(queryParam, &ret),
		gl.glGetError());
	gl.log() << TestLog::Message << "// Single integer output: " << ret << TestLog::EndMessage;
	return ret;
}